

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O1

int png_zlib_inflate(png_structrp png_ptr,int flush)

{
  int iVar1;
  
  if ((png_ptr->zstream_start != '\0') && ((png_ptr->zstream).avail_in != 0)) {
    if ((char)*(png_ptr->zstream).next_in < '\0') {
      (png_ptr->zstream).msg = "invalid window size (libpng)";
      return -3;
    }
    png_ptr->zstream_start = '\0';
  }
  iVar1 = inflate(&png_ptr->zstream,flush);
  return iVar1;
}

Assistant:

int /* PRIVATE */
png_zlib_inflate(png_structrp png_ptr, int flush)
{
   if (png_ptr->zstream_start && png_ptr->zstream.avail_in > 0)
   {
      if ((*png_ptr->zstream.next_in >> 4) > 7)
      {
         png_ptr->zstream.msg = "invalid window size (libpng)";
         return Z_DATA_ERROR;
      }

      png_ptr->zstream_start = 0;
   }

   return inflate(&png_ptr->zstream, flush);
}